

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_simple_motion_search_early_term_none
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,RD_STATS *none_rdc,
               PartitionSearchState *part_state)

{
  BLOCK_SIZE bsize;
  bool bVar1;
  _Bool _Var2;
  int i;
  long lVar3;
  BLOCK_SIZE bsize_00;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float score;
  float fVar7;
  float features [28];
  aom_partition_features_t features_1;
  aom_partition_decision_t decision;
  
  bsize = (part_state->part_blk_params).bsize;
  features[0x18] = 0.0;
  features[0x19] = 0.0;
  features[0x1a] = 0.0;
  features[0x1b] = 0.0;
  features[0x14] = 0.0;
  features[0x15] = 0.0;
  features[0x16] = 0.0;
  features[0x17] = 0.0;
  features[0x10] = 0.0;
  features[0x11] = 0.0;
  features[0x12] = 0.0;
  features[0x13] = 0.0;
  features[0xc] = 0.0;
  features[0xd] = 0.0;
  features[0xe] = 0.0;
  features[0xf] = 0.0;
  features[8] = 0.0;
  features[9] = 0.0;
  features[10] = 0.0;
  features[0xb] = 0.0;
  features[4] = 0.0;
  features[5] = 0.0;
  features[6] = 0.0;
  features[7] = 0.0;
  features[0] = 0.0;
  features[1] = 0.0;
  features[2] = 0.0;
  features[3] = 0.0;
  bsize_00 = bsize;
  simple_motion_search_prune_part_features
            (cpi,x,sms_tree,(part_state->part_blk_params).mi_row,
             (part_state->part_blk_params).mi_col,bsize,features,7);
  fVar7 = log1pf((float)none_rdc->rate);
  features[0x19] = fVar7;
  fVar7 = log1pf((float)none_rdc->dist);
  features[0x1a] = fVar7;
  fVar7 = log1pf((float)none_rdc->rdcost);
  features[0x1b] = fVar7;
  switch(bsize) {
  case BLOCK_16X16:
    pfVar6 = av1_simple_motion_search_term_none_model_16;
    pfVar4 = av1_simple_motion_search_term_none_std_16;
    pfVar5 = av1_simple_motion_search_term_none_mean_16;
    break;
  default:
    bVar1 = true;
    pfVar5 = (float *)0x0;
    pfVar4 = (float *)0x0;
    pfVar6 = (float *)0x0;
    goto LAB_001cf11f;
  case BLOCK_32X32:
    pfVar6 = av1_simple_motion_search_term_none_model_32;
    pfVar4 = av1_simple_motion_search_term_none_std_32;
    pfVar5 = av1_simple_motion_search_term_none_mean_32;
    break;
  case BLOCK_64X64:
    pfVar6 = av1_simple_motion_search_term_none_model_64;
    pfVar4 = av1_simple_motion_search_term_none_std_64;
    pfVar5 = av1_simple_motion_search_term_none_mean_64;
    break;
  case BLOCK_128X128:
    pfVar6 = av1_simple_motion_search_term_none_model_128;
    pfVar4 = av1_simple_motion_search_term_none_std_128;
    pfVar5 = av1_simple_motion_search_term_none_mean_128;
  }
  bVar1 = false;
LAB_001cf11f:
  write_features_to_file
            ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,features,0x1c
             ,3,bsize_00,(int)features[0],(int)features[2]);
  if (((cpi->ext_part_controller).ready == 0) ||
     (((cpi->common).current_frame.frame_type & 0xfd) == 0)) {
    _Var2 = false;
  }
  else {
    features_1.id = AOM_EXT_PART_FEATURE_AFTER_NONE_PART2;
    for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 1) {
      features_1.after_part_none.f_terminate[lVar3] = features[lVar3];
    }
    av1_ext_part_send_features(&cpi->ext_part_controller,&features_1);
    _Var2 = av1_ext_part_get_partition_decision(&cpi->ext_part_controller,&decision);
    if (_Var2) {
      part_state->terminate_partition_search = decision.terminate_partition_search;
    }
  }
  if (!bVar1 && _Var2 == false) {
    fVar7 = 0.0;
    for (lVar3 = 0; lVar3 != 0x1c; lVar3 = lVar3 + 1) {
      fVar7 = fVar7 + ((features[lVar3] - pfVar5[lVar3]) * pfVar6[lVar3]) / pfVar4[lVar3];
    }
    if (0.0 <= fVar7 + pfVar6[0x1c]) {
      part_state->terminate_partition_search = 1;
    }
  }
  return;
}

Assistant:

void av1_simple_motion_search_early_term_none(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    const RD_STATS *none_rdc, PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  float features[FEATURE_SIZE_SMS_TERM_NONE] = { 0.0f };
  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, features,
                                           FEATURE_SMS_PRUNE_PART_FLAG);
  int f_idx = FEATURE_SIZE_SMS_PRUNE_PART;

  features[f_idx++] = log1pf((float)none_rdc->rate);
  features[f_idx++] = log1pf((float)none_rdc->dist);
  features[f_idx++] = log1pf((float)none_rdc->rdcost);

  assert(f_idx == FEATURE_SIZE_SMS_TERM_NONE);

  const float *ml_mean = NULL;
  const float *ml_std = NULL;
  const float *ml_model = NULL;

  if (bsize == BLOCK_128X128) {
    ml_mean = av1_simple_motion_search_term_none_mean_128;
    ml_std = av1_simple_motion_search_term_none_std_128;
    ml_model = av1_simple_motion_search_term_none_model_128;
  } else if (bsize == BLOCK_64X64) {
    ml_mean = av1_simple_motion_search_term_none_mean_64;
    ml_std = av1_simple_motion_search_term_none_std_64;
    ml_model = av1_simple_motion_search_term_none_model_64;
  } else if (bsize == BLOCK_32X32) {
    ml_mean = av1_simple_motion_search_term_none_mean_32;
    ml_std = av1_simple_motion_search_term_none_std_32;
    ml_model = av1_simple_motion_search_term_none_model_32;
  } else if (bsize == BLOCK_16X16) {
    ml_mean = av1_simple_motion_search_term_none_mean_16;
    ml_std = av1_simple_motion_search_term_none_std_16;
    ml_model = av1_simple_motion_search_term_none_model_16;
  } else {
    assert(0 && "Unexpected block size in simple_motion_term_none");
  }

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         FEATURE_SIZE_SMS_TERM_NONE, 3, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_none_part2(
          cpi, features, &part_state->terminate_partition_search)) {
    return;
  }

  if (ml_model) {
    float score = 0.0f;
    for (f_idx = 0; f_idx < FEATURE_SIZE_SMS_TERM_NONE; f_idx++) {
      score +=
          ml_model[f_idx] * (features[f_idx] - ml_mean[f_idx]) / ml_std[f_idx];
    }
    score += ml_model[FEATURE_SIZE_SMS_TERM_NONE];

    if (score >= 0.0f) {
      part_state->terminate_partition_search = 1;
    }
  }
}